

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O2

QString * __thiscall
DelayImpEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DelayImpEntryWrapper *this,size_t fieldId)

{
  char *ch;
  
  switch(fieldId) {
  case 0:
    ch = "Attributes";
    break;
  case 1:
    ch = "Name Addr.";
    break;
  case 2:
    ch = "ModuleHandle";
    break;
  case 3:
    ch = "IAT";
    break;
  case 4:
    ch = "ImportNameTable";
    break;
  case 5:
    ch = "BoundIAT";
    break;
  case 6:
    ch = "UnloadIAT";
    break;
  case 7:
    ch = "Timestamp";
    break;
  default:
    (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString DelayImpEntryWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case ATTRS : return "Attributes";
        case NAME : return "Name Addr.";
        case MOD : return "ModuleHandle";
        case IAT : return "IAT";
        case INT : return "ImportNameTable";
        case BOUND_IAT : return "BoundIAT";
        case UNLOAD_IAT : return "UnloadIAT";
        case TIMESTAMP : return "Timestamp";
    }
    return getName();
}